

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-misc.c
# Opt level: O0

void do_cmd_note(void)

{
  _Bool _Var1;
  int iVar2;
  char local_b8 [3];
  undefined1 auStack_b5 [5];
  char note [90];
  undefined1 auStack_55 [2];
  undefined1 auStack_53 [3];
  char tmp [70];
  
  my_strcpy(note + 0x58,"",0x46);
  my_strcpy(local_b8,"",0x5a);
  _Var1 = get_string("Note: ",note + 0x58,0x46);
  if (((_Var1) && (note[0x58] != '\0')) && (note[0x58] != ' ')) {
    iVar2 = strncmp(note + 0x58,"/say ",5);
    if (iVar2 == 0) {
      strnfmt(local_b8,0x5a,"-- %s says: \"%s\"",player->full_name,auStack_53);
    }
    else {
      iVar2 = strncmp(note + 0x58,"/me",3);
      if (iVar2 == 0) {
        strnfmt(local_b8,0x5a,"-- %s%s",player->full_name,auStack_55);
      }
      else {
        strnfmt(local_b8,0x5a,"-- Note: %s",note + 0x58);
      }
    }
    msg("%s",auStack_b5);
    history_add(player,local_b8,L'\a');
  }
  return;
}

Assistant:

void do_cmd_note(void)
{
	/* Allocate/Initialize strings to get and format user input. */
	char tmp[70];
	char note[90];
	my_strcpy(tmp, "", sizeof(tmp));
	my_strcpy(note, "", sizeof(note));

	/* Read a line of input from the user */
	if (!get_string("Note: ", tmp, sizeof(tmp))) return;

	/* Ignore empty notes */
	if (!tmp[0] || (tmp[0] == ' ')) return;

	/* Format the note correctly, supporting some cute /me commands */
	if (strncmp(tmp, "/say ", 5) == 0)
		strnfmt(note, sizeof(note), "-- %s says: \"%s\"", player->full_name,
				&tmp[5]);
	else if (strncmp(tmp, "/me", 3) == 0)
		strnfmt(note, sizeof(note), "-- %s%s", player->full_name, &tmp[3]);
	else
		strnfmt(note, sizeof(note), "-- Note: %s", tmp);

	/* Display the note (omitting the "-- " prefix) */
	msg("%s", &note[3]);

	/* Add a history entry */
	history_add(player, note, HIST_USER_INPUT);
}